

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::debugging_internal::ParseSourceName(State *state)

{
  int iVar1;
  uint length_00;
  bool bVar2;
  long lVar3;
  char *str;
  int iVar4;
  int length;
  ParseState copy;
  uint local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  
  iVar4 = state->recursion_depth;
  iVar1 = state->steps;
  state->recursion_depth = iVar4 + 1;
  state->steps = iVar1 + 1;
  if (0x1ffff < iVar1 || 0xff < iVar4) {
    bVar2 = false;
    goto LAB_00141551;
  }
  local_38._0_4_ = (state->parse_state).mangled_idx;
  local_38._4_4_ = (state->parse_state).out_cur_idx;
  uStack_30 = *(undefined8 *)&(state->parse_state).prev_name_idx;
  local_3c = 0xffffffff;
  bVar2 = ParseNumber(state,(int *)&local_3c);
  length_00 = local_3c;
  iVar4 = state->recursion_depth;
  if (bVar2) {
    state->recursion_depth = iVar4 + 1;
    iVar1 = state->steps;
    state->steps = iVar1 + 1;
    if ((0xff < iVar4) || ((int)local_3c < 0 || 0x1ffff < iVar1)) goto LAB_00141540;
    str = state->mangled_begin + (state->parse_state).mangled_idx;
    bVar2 = AtLeastNumCharsRemaining(str,local_3c);
    if (!bVar2) goto LAB_00141540;
    if (length_00 < 0xc) {
LAB_00141564:
      MaybeAppendWithLength(state,str,length_00);
    }
    else {
      lVar3 = 0;
      while( true ) {
        if ((str[lVar3] == '\0') ||
           (str[lVar3] !=
            (&IdentifierIsAnonymousNamespace(absl::debugging_internal::State*,int)::anon_prefix)
            [lVar3])) break;
        lVar3 = lVar3 + 1;
      }
      if ((&IdentifierIsAnonymousNamespace(absl::debugging_internal::State*,int)::anon_prefix)
          [lVar3] != '\0') goto LAB_00141564;
      MaybeAppend(state,"(anonymous namespace)");
    }
    (state->parse_state).mangled_idx = (state->parse_state).mangled_idx + length_00;
    iVar4 = state->recursion_depth + -1;
    bVar2 = true;
  }
  else {
LAB_00141540:
    (state->parse_state).mangled_idx = (undefined4)local_38;
    (state->parse_state).out_cur_idx = local_38._4_4_;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_30;
    bVar2 = false;
  }
  iVar4 = iVar4 + -1;
LAB_00141551:
  state->recursion_depth = iVar4;
  return bVar2;
}

Assistant:

static bool ParseSourceName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  int length = -1;
  if (ParseNumber(state, &length) && ParseIdentifier(state, length)) {
    return true;
  }
  state->parse_state = copy;
  return false;
}